

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::ElemStack::addLevel(ElemStack *this,XMLElementDecl *toSet,XMLSize_t readerNum)

{
  StackElem *pSVar1;
  XMLSize_t XVar2;
  StackElem **ppSVar3;
  
  XVar2 = this->fStackTop;
  if (XVar2 == this->fStackCapacity) {
    expandStack(this);
    XVar2 = this->fStackTop;
  }
  ppSVar3 = this->fStack;
  pSVar1 = ppSVar3[XVar2];
  if (pSVar1 == (StackElem *)0x0) {
    pSVar1 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    XVar2 = this->fStackTop;
    this->fStack[XVar2] = pSVar1;
    ppSVar3 = this->fStack;
    pSVar1 = ppSVar3[XVar2];
    pSVar1->fChildCapacity = 0;
    pSVar1->fChildren = (QName **)0x0;
    pSVar1 = ppSVar3[XVar2];
    pSVar1->fMap = (PrefMapElem *)0x0;
    pSVar1->fMapCapacity = 0;
    ppSVar3[XVar2]->fSchemaElemName = (XMLCh *)0x0;
    pSVar1 = ppSVar3[XVar2];
    pSVar1->fSchemaElemNameMaxLen = 0;
  }
  pSVar1->fThisElement = toSet;
  pSVar1 = ppSVar3[XVar2];
  pSVar1->fReaderNum = readerNum;
  pSVar1->fChildCount = 0;
  pSVar1->fMapCount = 0;
  *(undefined4 *)((long)&pSVar1->fMapCount + 7) = 0;
  pSVar1->fCurrentURI = this->fUnknownNamespaceId;
  pSVar1->fCurrentScope = 0xfffffffe;
  pSVar1->fCurrentGrammar = (Grammar *)0x0;
  this->fStackTop = XVar2 + 1;
  return XVar2;
}

Assistant:

XMLSize_t ElemStack::addLevel(XMLElementDecl* const toSet, const XMLSize_t readerNum)
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fChildCapacity = 0;
        fStack[fStackTop]->fChildren = 0;
        fStack[fStackTop]->fMapCapacity = 0;
        fStack[fStackTop]->fMap = 0;
        fStack[fStackTop]->fSchemaElemName = 0;
        fStack[fStackTop]->fSchemaElemNameMaxLen = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fThisElement = toSet;
    fStack[fStackTop]->fReaderNum = readerNum;
    fStack[fStackTop]->fChildCount = 0;
    fStack[fStackTop]->fMapCount = 0;
    fStack[fStackTop]->fValidationFlag = false;
    fStack[fStackTop]->fCommentOrPISeen = false;
    fStack[fStackTop]->fReferenceEscaped = false;
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
    fStack[fStackTop]->fCurrentGrammar = 0;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}